

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<long_double>_>::ComputeCoarseStiffness
          (TPZDohrSubstruct<std::complex<long_double>_> *this)

{
  TPZMatrix<std::complex<long_double>_> *pTVar1;
  long in_RDI;
  int in_stack_000000a4;
  TPZFMatrix<std::complex<long_double>_> *in_stack_000000a8;
  TPZFMatrix<std::complex<long_double>_> *in_stack_000000b0;
  TPZFMatrix<std::complex<long_double>_> *in_stack_000000b8;
  TPZFMatrix<std::complex<long_double>_> *in_stack_000000c0;
  undefined1 in_stack_000000d0 [32];
  TPZFMatrix<std::complex<long_double>_> temp1;
  int64_t in_stack_ffffffffffffff10;
  int64_t in_stack_ffffffffffffff18;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff20;
  complex<long_double> local_c8;
  int64_t in_stack_ffffffffffffff58;
  int64_t in_stack_ffffffffffffff60;
  TPZFMatrix<std::complex<long_double>_> *in_stack_ffffffffffffff68;
  
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  TPZFMatrix<std::complex<long_double>_>::TPZFMatrix
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  TPZFMatrix<std::complex<long_double>_>::Resize
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  pTVar1 = TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_>::operator->
                     ((TPZAutoPointer<TPZMatrix<std::complex<long_double>_>_> *)(in_RDI + 0x610));
  (*(pTVar1->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar1,in_RDI + 0x370,&stack0xffffffffffffff68,0);
  std::complex<long_double>::complex(&local_c8,(longdouble)1,(longdouble)0);
  std::complex<long_double>::complex
            ((complex<long_double> *)&stack0xffffffffffffff18,(longdouble)0,(longdouble)0);
  TPZFMatrix<std::complex<long_double>_>::MultAdd
            (in_stack_000000c0,in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,
             (complex<long_double>)in_stack_000000d0,(complex<long_double>)temp1._16_32_,
             in_stack_000000a4);
  TPZFMatrix<std::complex<long_double>_>::~TPZFMatrix
            ((TPZFMatrix<std::complex<long_double>_> *)0x200e190);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ComputeCoarseStiffness() {
	TPZFMatrix<TVar> temp1(fNEquations,fCoarseIndex.NElements());
	fKCi.Resize(fCoarseIndex.NElements(),fCoarseIndex.NElements());
	fStiffness->Multiply(fPhiC,temp1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		temp1.Print("stiffness matrix times phi",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	fPhiC.MultAdd(temp1,temp1,fKCi,1,0,1);
#ifdef PZ_LOG
	if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		fKCi.Print("Coarse stiffness matrix",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}